

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::RenderDeviceVkImpl::~RenderDeviceVkImpl(RenderDeviceVkImpl *this)

{
  bool bVar1;
  Int32 IVar2;
  int32_t iVar3;
  pointer this_00;
  Char *pCVar4;
  undefined1 local_b0 [8];
  string msg_3;
  pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>
  *CmdPool;
  iterator __end1;
  iterator __begin1;
  unordered_map<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>_>
  *__range1;
  string msg_2;
  string msg_1;
  string msg;
  RenderDeviceVkImpl *this_local;
  
  VulkanDynamicMemoryManager::Destroy(&this->m_DynamicMemoryManager);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_ImplicitRenderPassCache);
  if (bVar1) {
    this_00 = std::
              unique_ptr<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>
              ::operator->(&this->m_ImplicitRenderPassCache);
    RenderPassCache::Destroy(this_00);
  }
  IdleGPU(this);
  ReleaseStaleResources(this,true);
  IVar2 = DescriptorSetAllocator::GetAllocatedDescriptorSetCounter(&this->m_DescriptorSetAllocator);
  if (IVar2 != 0) {
    FormatString<char[59]>
              ((string *)((long)&msg_1.field_2 + 8),
               (char (*) [59])"All allocated descriptor sets must have been released now.");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"~RenderDeviceVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0xe3);
    std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
  }
  IVar2 = DescriptorPoolManager::GetAllocatedPoolCounter(&this->m_DynamicDescriptorPool);
  if (IVar2 != 0) {
    FormatString<char[68]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [68])"All allocated dynamic descriptor pools must have been released now.")
    ;
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"~RenderDeviceVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0xe4);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  IVar2 = DynamicHeap::MasterBlockListBasedManager::GetMasterBlockCounter
                    (&(this->m_DynamicMemoryManager).super_MasterBlockListBasedManager);
  if (IVar2 != 0) {
    FormatString<char[73]>
              ((string *)&__range1,
               (char (*) [73])
               "All allocated dynamic master blocks must have been returned to the pool.");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"~RenderDeviceVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0xe5);
    std::__cxx11::string::~string((string *)&__range1);
  }
  __end1 = std::
           unordered_map<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>_>
           ::begin(&this->m_TransientCmdPoolMgrs);
  CmdPool = (pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>
             *)std::
               unordered_map<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>_>
               ::end(&this->m_TransientCmdPoolMgrs);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
                            ,(_Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
                              *)&CmdPool), bVar1) {
    msg_3.field_2._8_8_ =
         std::__detail::
         _Node_iterator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false,_false>
         ::operator*(&__end1);
    iVar3 = CommandPoolManager::GetAllocatedPoolCount(&((reference)msg_3.field_2._8_8_)->second);
    if (iVar3 != 0) {
      FormatString<char[208]>
                ((string *)local_b0,
                 (char (*) [208])
                 "All allocated transient command pools must have been released now. If there are outstanding references to the pools in release queues, the app will crash when CommandPoolManager::FreeCommandPool() is called."
                );
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"~RenderDeviceVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
                 ,0xea);
      std::__cxx11::string::~string((string *)local_b0);
    }
    CommandPoolManager::DestroyPools((CommandPoolManager *)(msg_3.field_2._8_8_ + 8));
    std::__detail::
    _Node_iterator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false,_false>
    ::operator++(&__end1);
  }
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ::DestroyCommandQueues
            (&this->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            );
  std::unique_ptr<Diligent::IDXCompiler,_std::default_delete<Diligent::IDXCompiler>_>::~unique_ptr
            (&this->m_pDxCompiler);
  VulkanDynamicMemoryManager::~VulkanDynamicMemoryManager(&this->m_DynamicMemoryManager);
  VulkanUtilities::VulkanMemoryManager::~VulkanMemoryManager(&this->m_MemoryMgr);
  std::
  vector<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>,_std::allocator<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>_>_>
  ::~vector(&this->m_QueryMgrs);
  std::
  unordered_map<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>_>
  ::~unordered_map(&this->m_TransientCmdPoolMgrs);
  DescriptorPoolManager::~DescriptorPoolManager(&this->m_DynamicDescriptorPool);
  DescriptorSetAllocator::~DescriptorSetAllocator(&this->m_DescriptorSetAllocator);
  std::unique_ptr<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>::
  ~unique_ptr(&this->m_ImplicitRenderPassCache);
  std::unique_ptr<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>::
  ~unique_ptr(&this->m_FramebufferCache);
  std::shared_ptr<VulkanUtilities::VulkanLogicalDevice>::~shared_ptr(&this->m_LogicalVkDevice);
  std::
  unique_ptr<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
  ::~unique_ptr(&this->m_PhysicalDevice);
  std::shared_ptr<VulkanUtilities::VulkanInstance>::~shared_ptr(&this->m_VulkanInstance);
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ::~RenderDeviceNextGenBase
            (&this->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            );
  return;
}

Assistant:

RenderDeviceVkImpl::~RenderDeviceVkImpl()
{
    // Explicitly destroy dynamic heap. This will move resources owned by
    // the heap into release queues
    m_DynamicMemoryManager.Destroy();

    // Explicitly destroy render pass cache
    if (m_ImplicitRenderPassCache)
    {
        m_ImplicitRenderPassCache->Destroy();
    }

    // Wait for the GPU to complete all its operations
    IdleGPU();

    ReleaseStaleResources(true);

    DEV_CHECK_ERR(m_DescriptorSetAllocator.GetAllocatedDescriptorSetCounter() == 0, "All allocated descriptor sets must have been released now.");
    DEV_CHECK_ERR(m_DynamicDescriptorPool.GetAllocatedPoolCounter() == 0, "All allocated dynamic descriptor pools must have been released now.");
    DEV_CHECK_ERR(m_DynamicMemoryManager.GetMasterBlockCounter() == 0, "All allocated dynamic master blocks must have been returned to the pool.");

    // Immediately destroys all command pools
    for (auto& CmdPool : m_TransientCmdPoolMgrs)
    {
        DEV_CHECK_ERR(CmdPool.second.GetAllocatedPoolCount() == 0, "All allocated transient command pools must have been released now. If there are outstanding references to the pools in release queues, the app will crash when CommandPoolManager::FreeCommandPool() is called.");
        CmdPool.second.DestroyPools();
    }

    // We must destroy command queues explicitly prior to releasing Vulkan device
    DestroyCommandQueues();

    //if(m_PhysicalDevice)
    //{
    //    // If m_PhysicalDevice is empty, the device does not own vulkan logical device and must not
    //    // destroy it
    //    vkDestroyDevice(m_VkDevice, m_VulkanInstance->GetVkAllocator());
    //}
}